

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

uint64 __thiscall google::protobuf::internal::ArenaImpl::SerialArena::SpaceUsed(SerialArena *this)

{
  long lVar1;
  Block *pBVar2;
  
  pBVar2 = this->head_;
  lVar1 = (long)this->ptr_ - (long)pBVar2;
  while( true ) {
    pBVar2 = pBVar2->next_;
    if (pBVar2 == (Block *)0x0) break;
    lVar1 = lVar1 + -0x18 + pBVar2->pos_;
  }
  return lVar1 - 0x60;
}

Assistant:

uint64 ArenaImpl::SerialArena::SpaceUsed() const {
  // Get current block's size from ptr_ (since we can't trust head_->pos().
  uint64 space_used = ptr_ - head_->Pointer(kBlockHeaderSize);
  // Get subsequent block size from b->pos().
  for (Block* b = head_->next(); b; b = b->next()) {
    space_used += (b->pos() - kBlockHeaderSize);
  }
  // Remove the overhead of the SerialArena itself.
  space_used -= kSerialArenaSize;
  return space_used;
}